

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void tchecker::clockbounds::compute_clockbounds(system_t *system,clockbounds_t *clockbounds)

{
  bool bVar1;
  edge_id_t eVar2;
  loc_id_t lVar3;
  loc_id_t tgt;
  df_solver_t *this;
  const_iterator_t *pcVar4;
  element_type *peVar5;
  edges_collection_const_iterator_t *peVar6;
  element_type *peVar7;
  typed_expression_t *ptVar8;
  typed_statement_t *stmt;
  element_type *this_00;
  element_type *peVar9;
  runtime_error *this_01;
  element_type *global_lu_map;
  element_type *peVar10;
  element_type *global_m_map;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar11;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar12;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [31];
  bool has_solution;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  edge_const_shared_ptr_t *edge;
  edges_collection_const_iterator_t __end2_1;
  edges_collection_const_iterator_t __begin2_1;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *__range2_1;
  __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_68;
  loc_const_shared_ptr_t *loc;
  const_iterator_t __end2;
  const_iterator_t __begin2;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  *__range2;
  undefined1 local_28 [8];
  shared_ptr<tchecker::clockbounds::df_solver_t> solver;
  clockbounds_t *clockbounds_local;
  system_t *system_local;
  
  solver.super___shared_ptr<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)clockbounds;
  this = (df_solver_t *)operator_new(0x40);
  df_solver_t::df_solver_t(this,system);
  std::shared_ptr<tchecker::clockbounds::df_solver_t>::
  shared_ptr<tchecker::clockbounds::df_solver_t,void>
            ((shared_ptr<tchecker::clockbounds::df_solver_t> *)local_28,this);
  rVar11 = tchecker::system::locs_t::locations
                     (&(system->super_system_t).super_system_t.super_locs_t);
  __begin2 = rVar11._begin.super_const_iterator._M_current;
  pcVar4 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
           ::begin((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                    *)&__begin2);
  __end2.super_const_iterator._M_current = (const_iterator)(pcVar4->super_const_iterator)._M_current
  ;
  pcVar4 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
           ::end((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                  *)&__begin2);
  loc = (loc_const_shared_ptr_t *)(pcVar4->super_const_iterator)._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2.super_const_iterator,
                       (__normal_iterator<const_std::shared_ptr<tchecker::system::loc_t>_*,_std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>
                        *)&loc);
    if (!bVar1) break;
    tchecker::system::locs_t::const_iterator_t::operator*((const_iterator_t *)&__range2_1);
    local_68 = (__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&__range2_1;
    peVar5 = std::
             __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_68);
    lVar3 = tchecker::system::loc_t::id(peVar5);
    ptVar8 = ta::system_t::invariant(system,lVar3);
    peVar5 = std::
             __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_68);
    lVar3 = tchecker::system::loc_t::id(peVar5);
    add_location_constraints
              (ptVar8,lVar3,(shared_ptr<tchecker::clockbounds::df_solver_t> *)local_28);
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)&__range2_1);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::loc_t>_*,_std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>
    ::operator++(&__end2.super_const_iterator);
  }
  rVar12 = tchecker::system::edges_t::edges(&(system->super_system_t).super_system_t.super_edges_t);
  __begin2_1 = rVar12._begin.super_const_iterator._M_current;
  peVar6 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::begin((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                    *)&__begin2_1);
  __end2_1.super_const_iterator._M_current =
       (const_iterator)(peVar6->super_const_iterator)._M_current;
  peVar6 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::end((range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
                  *)&__begin2_1);
  edge = (edge_const_shared_ptr_t *)(peVar6->super_const_iterator)._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1.super_const_iterator,
                       (__normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
                        *)&edge);
    if (!bVar1) break;
    tchecker::system::edges_collection_const_iterator_t::operator*
              ((edges_collection_const_iterator_t *)(local_d0 + 0x18));
    local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 0x18);
    peVar7 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8._M_pi);
    eVar2 = tchecker::system::edge_t::id(peVar7);
    ptVar8 = ta::system_t::guard(system,eVar2);
    peVar7 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8._M_pi);
    eVar2 = tchecker::system::edge_t::id(peVar7);
    stmt = ta::system_t::statement(system,eVar2);
    peVar7 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8._M_pi);
    lVar3 = tchecker::system::edge_t::src(peVar7);
    peVar7 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a8._M_pi);
    tgt = tchecker::system::edge_t::tgt(peVar7);
    add_edge_constraints
              (ptVar8,stmt,lVar3,tgt,(shared_ptr<tchecker::clockbounds::df_solver_t> *)local_28);
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)(local_d0 + 0x18));
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
    ::operator++(&__end2_1.super_const_iterator);
  }
  this_00 = std::
            __shared_ptr_access<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tchecker::clockbounds::df_solver_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
  clockbounds_t::local_lu_map((clockbounds_t *)local_d0);
  peVar9 = std::
           __shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_d0);
  bVar1 = df_solver_t::solve(this_00,peVar9);
  std::shared_ptr<tchecker::clockbounds::local_lu_map_t>::~shared_ptr
            ((shared_ptr<tchecker::clockbounds::local_lu_map_t> *)local_d0);
  local_d0[0x17] = bVar1;
  if (!bVar1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"compute_clockbounds: clock bounds cannot be computed");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  clockbounds_t::global_lu_map((clockbounds_t *)local_e0);
  global_lu_map =
       std::
       __shared_ptr_access<tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_e0);
  clockbounds_t::local_lu_map((clockbounds_t *)local_f0);
  peVar9 = std::
           __shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_f0);
  fill_global_lu_map(global_lu_map,peVar9);
  std::shared_ptr<tchecker::clockbounds::local_lu_map_t>::~shared_ptr
            ((shared_ptr<tchecker::clockbounds::local_lu_map_t> *)local_f0);
  std::shared_ptr<tchecker::clockbounds::global_lu_map_t>::~shared_ptr
            ((shared_ptr<tchecker::clockbounds::global_lu_map_t> *)local_e0);
  clockbounds_t::local_m_map((clockbounds_t *)local_100);
  peVar10 = std::
            __shared_ptr_access<tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_100);
  clockbounds_t::local_lu_map((clockbounds_t *)local_110);
  peVar9 = std::
           __shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_110);
  fill_local_m_map(peVar10,peVar9);
  std::shared_ptr<tchecker::clockbounds::local_lu_map_t>::~shared_ptr
            ((shared_ptr<tchecker::clockbounds::local_lu_map_t> *)local_110);
  std::shared_ptr<tchecker::clockbounds::local_m_map_t>::~shared_ptr
            ((shared_ptr<tchecker::clockbounds::local_m_map_t> *)local_100);
  clockbounds_t::global_m_map((clockbounds_t *)local_120);
  global_m_map = std::
                 __shared_ptr_access<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_120);
  clockbounds_t::local_lu_map((clockbounds_t *)local_130);
  peVar9 = std::
           __shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_130);
  fill_global_m_map(global_m_map,peVar9);
  std::shared_ptr<tchecker::clockbounds::local_lu_map_t>::~shared_ptr
            ((shared_ptr<tchecker::clockbounds::local_lu_map_t> *)local_130);
  std::shared_ptr<tchecker::clockbounds::global_m_map_t>::~shared_ptr
            ((shared_ptr<tchecker::clockbounds::global_m_map_t> *)local_120);
  std::shared_ptr<tchecker::clockbounds::df_solver_t>::~shared_ptr
            ((shared_ptr<tchecker::clockbounds::df_solver_t> *)local_28);
  return;
}

Assistant:

void compute_clockbounds(tchecker::ta::system_t const & system, tchecker::clockbounds::clockbounds_t & clockbounds)
{
  std::shared_ptr<tchecker::clockbounds::df_solver_t> solver{new tchecker::clockbounds::df_solver_t{system}};

  for (tchecker::system::loc_const_shared_ptr_t const & loc : system.locations())
    tchecker::clockbounds::add_location_constraints(system.invariant(loc->id()), loc->id(), solver);

  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges())
    tchecker::clockbounds::add_edge_constraints(system.guard(edge->id()), system.statement(edge->id()), edge->src(),
                                                edge->tgt(), solver);

  bool const has_solution = solver->solve(*clockbounds.local_lu_map());
  if (!has_solution)
    throw std::runtime_error("compute_clockbounds: clock bounds cannot be computed");

  tchecker::clockbounds::fill_global_lu_map(*clockbounds.global_lu_map(), *clockbounds.local_lu_map());
  tchecker::clockbounds::fill_local_m_map(*clockbounds.local_m_map(), *clockbounds.local_lu_map());
  tchecker::clockbounds::fill_global_m_map(*clockbounds.global_m_map(), *clockbounds.local_lu_map());
}